

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ValueFederateManager::getUpdateFromCore
          (ValueFederateManager *this,InterfaceHandle updatedHandle)

{
  void *pvVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined4 in_register_00000034;
  shared_ptr<const_helics::SmallBuffer> data;
  handle inpHandle;
  BlockIterator<helics::Input,_32,_helics::Input_**> fid;
  InterfaceHandle local_94;
  __shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2> local_90;
  handle local_80;
  data_view local_68;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_48;
  undefined8 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  local_94.hid = updatedHandle.hid;
  iVar5 = (*this->coreObject->_vptr_Core[0x32])
                    (this->coreObject,CONCAT44(in_register_00000034,updatedHandle.hid),0);
  std::__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,
             (__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(extraout_var,iVar5));
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_80,&this->inputs);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_48,local_80.data,&local_94);
  gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
            ((const_iterator *)&local_68,&(local_80.data)->dataStorage);
  bVar4 = gmlc::containers::BlockIterator<helics::Input,32,helics::Input**>::operator!=
                    ((BlockIterator<helics::Input,32,helics::Input**> *)&local_48,
                     (BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *)
                     &local_68);
  _Var3._M_pi = local_90._M_refcount._M_pi;
  peVar2 = local_90._M_ptr;
  if (bVar4) {
    pvVar1 = (local_48.ptr)->dataReference;
    local_90._M_ptr = (element_type *)0x0;
    local_90._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.dblock._M_len = peVar2->bufferSize;
    local_68.dblock._M_str = (char *)peVar2->heap;
    local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar2;
    local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    local_30 = 0;
    _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    data_view::operator=((data_view *)((long)pvVar1 + 8),&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28);
    *(baseType *)((long)pvVar1 + 0x28) = (this->CurrentTime).internalTimeCode;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_80.m_handle_lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  return;
}

Assistant:

void ValueFederateManager::getUpdateFromCore(InterfaceHandle updatedHandle)
{
    auto data = coreObject->getValue(updatedHandle);
    auto inpHandle = inputs.lock();
    /** find the id*/
    auto fid = inpHandle->find(updatedHandle);
    if (fid != inpHandle->end()) {  // assign the data

        auto* info = static_cast<InputData*>(fid->dataReference);
        info->lastData = data_view(std::move(data));
        info->lastUpdate = CurrentTime;
    }
}